

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O0

void Swp_ManStop(Gia_Man_t *pGia)

{
  void *__ptr;
  Swp_Man_t *p;
  Gia_Man_t *pGia_local;
  
  __ptr = pGia->pData;
  sat_solver_delete(*(sat_solver **)((long)__ptr + 0x28));
  Vec_IntFree(*(Vec_Int_t **)((long)__ptr + 0x40));
  Vec_IntFree(*(Vec_Int_t **)((long)__ptr + 0x48));
  Vec_IntFree(*(Vec_Int_t **)((long)__ptr + 0x30));
  Vec_IntFree(*(Vec_Int_t **)((long)__ptr + 0x38));
  Vec_IntFree(*(Vec_Int_t **)((long)__ptr + 0x10));
  Vec_IntFree(*(Vec_Int_t **)((long)__ptr + 0x18));
  Vec_IntFree(*(Vec_Int_t **)((long)__ptr + 0x20));
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  pGia->pData = (void *)0x0;
  return;
}

Assistant:

static inline void Swp_ManStop( Gia_Man_t * pGia )
{
    Swp_Man_t * p = (Swp_Man_t *)pGia->pData;
    sat_solver_delete( p->pSat );
    Vec_IntFree( p->vFanins );
    Vec_IntFree( p->vCexSwp );
    Vec_IntFree( p->vId2Lit );
    Vec_IntFree( p->vFront );
    Vec_IntFree( p->vProbes );
    Vec_IntFree( p->vCondProbes );
    Vec_IntFree( p->vCondAssump );
    ABC_FREE( p );
    pGia->pData = NULL;
}